

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall
glu::sl::ShaderParser::parseValueElement(ShaderParser *this,DataType expectedDataType,Value *result)

{
  pointer *ppEVar1;
  iterator __position;
  DataType DVar2;
  uint uVar3;
  int iVar4;
  undefined8 extraout_RAX;
  Element EVar5;
  ulong uVar6;
  Token TVar7;
  ulong uVar8;
  int iVar9;
  Element *__args;
  float fVar10;
  double dVar11;
  Element elems [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Element local_78 [18];
  
  DVar2 = getDataTypeScalarType(expectedDataType);
  uVar3 = getDataTypeScalarSize(expectedDataType);
  uVar8 = (ulong)uVar3;
  if (1 < (int)uVar3) {
    advanceToken(this);
    assumeToken(this,TOKEN_LEFT_PAREN);
    advanceToken(this);
  }
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      if (DVar2 == TYPE_FLOAT) {
        fVar10 = 1.0;
        if (this->m_curToken == TOKEN_MINUS) {
          advanceToken(this);
          fVar10 = -1.0;
        }
        TVar7 = TOKEN_FLOAT_LITERAL;
        assumeToken(this,TOKEN_FLOAT_LITERAL);
        dVar11 = atof((this->m_curTokenStr)._M_dataplus._M_p);
        local_78[uVar6].float32 = (float)dVar11 * fVar10;
LAB_01968a5e:
        assumeToken(this,TVar7);
      }
      else {
        if ((DVar2 & ~TYPE_FLOAT_VEC4) == TYPE_INT) {
          iVar9 = 1;
          if (this->m_curToken == TOKEN_MINUS) {
            advanceToken(this);
            iVar9 = -1;
          }
          TVar7 = TOKEN_INT_LITERAL;
          assumeToken(this,TOKEN_INT_LITERAL);
          iVar4 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
          local_78[uVar6].int32 = iVar4 * iVar9;
          goto LAB_01968a5e;
        }
        TVar7 = this->m_curToken;
        EVar5.int32._1_3_ = 0;
        EVar5.int32._0_1_ = TVar7 == TOKEN_TRUE;
        local_78[uVar6] = EVar5;
        if (1 < TVar7 - TOKEN_TRUE) {
          std::operator+(&local_98,"unexpected token, expecting bool: ",&this->m_curTokenStr);
          parseError(this,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
      }
      advanceToken(this);
      if (uVar3 - 1 != uVar6) {
        assumeToken(this,TOKEN_COMMA);
        advanceToken(this);
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  if (1 < (int)uVar3) {
    assumeToken(this,TOKEN_RIGHT_PAREN);
    advanceToken(this);
  }
  if (0 < (int)uVar3) {
    __args = local_78;
    do {
      __position._M_current =
           (result->elements).
           super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (result->elements).
          super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glu::sl::Value::Element,std::allocator<glu::sl::Value::Element>>::
        _M_realloc_insert<glu::sl::Value::Element_const&>
                  ((vector<glu::sl::Value::Element,std::allocator<glu::sl::Value::Element>> *)
                   &result->elements,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppEVar1 = &(result->elements).
                   super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      __args = __args + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void ShaderParser::parseValueElement (DataType expectedDataType, Value& result)
{
	DataType	scalarType	= getDataTypeScalarType(expectedDataType);
	int			scalarSize	= getDataTypeScalarSize(expectedDataType);

	/* \todo [2010-04-19 petri] Support arrays. */
	Value::Element elems[16];

	if (scalarSize > 1)
	{
		DE_ASSERT(mapDataTypeToken(m_curToken) == expectedDataType);
		advanceToken(); // data type (float, vec2, etc.)
		advanceToken(TOKEN_LEFT_PAREN);
	}

	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
	{
		if (scalarType == TYPE_FLOAT)
		{
			float signMult = 1.0f;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1.0f;
				advanceToken();
			}

			assumeToken(TOKEN_FLOAT_LITERAL);
			elems[scalarNdx].float32 = signMult * parseFloatLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_FLOAT_LITERAL);
		}
		else if (scalarType == TYPE_INT || scalarType == TYPE_UINT)
		{
			int signMult = 1;
			if (m_curToken == TOKEN_MINUS)
			{
				signMult = -1;
				advanceToken();
			}

			assumeToken(TOKEN_INT_LITERAL);
			elems[scalarNdx].int32 = signMult * parseIntLiteral(m_curTokenStr.c_str());
			advanceToken(TOKEN_INT_LITERAL);
		}
		else
		{
			DE_ASSERT(scalarType == TYPE_BOOL);
			elems[scalarNdx].bool32 = (m_curToken == TOKEN_TRUE);
			if (m_curToken != TOKEN_TRUE && m_curToken != TOKEN_FALSE)
				parseError(string("unexpected token, expecting bool: " + m_curTokenStr));
			advanceToken(); // true/false
		}

		if (scalarNdx != (scalarSize - 1))
			advanceToken(TOKEN_COMMA);
	}

	if (scalarSize > 1)
		advanceToken(TOKEN_RIGHT_PAREN);

	// Store results.
	for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		result.elements.push_back(elems[scalarNdx]);
}